

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall wasm::TypeBuilder::Impl::Entry::Entry(Entry *this)

{
  pointer __p;
  pointer __p_00;
  HeapTypeInfo local_68;
  
  (this->info)._M_t.
  super___uniq_ptr_impl<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  .super__Head_base<0UL,_wasm::(anonymous_namespace)::HeapTypeInfo_*,_false>._M_head_impl =
       (HeapTypeInfo *)0x0;
  this->initialized = false;
  __p_00 = (pointer)operator_new(0x40);
  __p_00->isTemp = false;
  __p_00->isFinalized = true;
  __p_00->recGroupIndex = 0;
  __p_00->supertype = (HeapTypeInfo *)0x0;
  __p_00->recGroup = (RecGroupInfo *)0x0;
  __p_00->kind = SignatureKind;
  (__p_00->field_6).struct_.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_00->field_6).struct_.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.isTemp = false;
  local_68.isFinalized = false;
  local_68._2_6_ = 0;
  std::
  __uniq_ptr_impl<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::reset((__uniq_ptr_impl<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
           *)this,__p_00);
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                 *)&local_68);
  local_68._0_2_ = 0x100;
  local_68.recGroupIndex = 0;
  local_68.supertype = (HeapTypeInfo *)0x0;
  local_68.recGroup = (RecGroupInfo *)0x0;
  local_68.field_6.struct_.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.field_6.struct_.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.kind = SignatureKind;
  set(this,&local_68);
  anon_unknown_0::HeapTypeInfo::~HeapTypeInfo(&local_68);
  this->initialized = false;
  return;
}

Assistant:

Entry() {
      // We need to eagerly allocate the HeapTypeInfo so we have a TypeID to use
      // to refer to it before it is initialized. Arbitrarily choose a default
      // value.
      info = std::make_unique<HeapTypeInfo>(Signature());
      set(Signature());
      initialized = false;
    }